

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O0

bool verona::subtype(Btypes *predicates,Btype *sub,Btype *sup,Bounds *bounds)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
  local_118;
  const_iterator local_110;
  undefined1 local_108 [8];
  Sequent seq;
  Bounds *bounds_local;
  Btype *sup_local;
  Btype *sub_local;
  Btypes *predicates_local;
  
  seq.bounds._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)bounds;
  Sequent::Sequent((Sequent *)local_108);
  local_118._M_current =
       (shared_ptr<verona::BtypeDef> *)
       std::
       vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
       ::end((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
              *)local_108);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<verona::BtypeDef>const*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>
  ::__normal_iterator<std::shared_ptr<verona::BtypeDef>*>
            ((__normal_iterator<std::shared_ptr<verona::BtypeDef>const*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>
              *)&local_110,&local_118);
  __first = std::
            vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
            ::begin(predicates);
  __last = std::
           vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
           ::end(predicates);
  ::std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::shared_ptr<verona::BtypeDef>*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>,void>
            ((vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
              *)local_108,local_110,
             (__normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::shared_ptr<verona::BtypeDef>_*,_std::vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>_>
              )__last._M_current);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             *)local_108,(value_type *)sub);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back((vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             *)&seq.lhs_pending.
                super__Vector_base<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)sup);
  bVar1 = Sequent::reduce((Sequent *)local_108);
  if (bVar1) {
    merge((Bounds *)seq.bounds._M_t._M_impl.super__Rb_tree_header._M_node_count,
          (Bounds *)
          &seq.assumptions.super__Vector_base<verona::Assume,_std::allocator<verona::Assume>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  Sequent::~Sequent((Sequent *)local_108);
  return bVar1;
}

Assistant:

bool subtype(Btypes& predicates, Btype sub, Btype sup, Bounds& bounds)
  {
    Sequent seq;
    seq.lhs_pending.insert(
      seq.lhs_pending.end(), predicates.begin(), predicates.end());
    seq.lhs_pending.push_back(sub);
    seq.rhs_pending.push_back(sup);

    if (!seq.reduce())
      return false;

    merge(bounds, seq.bounds);
    return true;
  }